

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaAttributePtr_conflict
xmlSchemaAddAttribute
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlChar *name,xmlChar *nsName,
          xmlNodePtr node,int topLevel)

{
  xmlSchemaAttributePtr_conflict __s;
  bool bVar1;
  
  __s = (xmlSchemaAttributePtr_conflict)(*xmlMalloc)(0x98);
  if (__s == (xmlSchemaAttributePtr_conflict)0x0) {
    if (ctxt != (xmlSchemaParserCtxtPtr)0x0) {
      ctxt->nberrors = ctxt->nberrors + 1;
    }
    __s = (xmlSchemaAttributePtr_conflict)0x0;
    __xmlSimpleError(0x10,2,(xmlNodePtr)0x0,(char *)0x0,"allocating attribute");
  }
  else {
    memset(__s,0,0x98);
    __s->type = XML_SCHEMA_TYPE_ATTRIBUTE;
    __s->node = (xmlNodePtr)nsName;
    __s->name = (xmlChar *)schema;
    __s->targetNamespace = name;
    bVar1 = (int)node == 0;
    xmlSchemaAddItemSize(&ctxt->constructor->bucket->globals + bVar1,(uint)bVar1 * 5 + 5,__s);
    xmlSchemaAddItemSize(&ctxt->constructor->pending,10,__s);
  }
  return __s;
}

Assistant:

static xmlSchemaAttributePtr
xmlSchemaAddAttribute(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                      const xmlChar * name, const xmlChar * nsName,
		      xmlNodePtr node, int topLevel)
{
    xmlSchemaAttributePtr ret = NULL;

    if ((ctxt == NULL) || (schema == NULL))
        return (NULL);

    ret = (xmlSchemaAttributePtr) xmlMalloc(sizeof(xmlSchemaAttribute));
    if (ret == NULL) {
        xmlSchemaPErrMemory(ctxt, "allocating attribute", NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaAttribute));
    ret->type = XML_SCHEMA_TYPE_ATTRIBUTE;
    ret->node = node;
    ret->name = name;
    ret->targetNamespace = nsName;

    if (topLevel)
	WXS_ADD_GLOBAL(ctxt, ret);
    else
	WXS_ADD_LOCAL(ctxt, ret);
    WXS_ADD_PENDING(ctxt, ret);
    return (ret);
}